

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O0

Contrib_List *
crnlib::Resampler::make_clist
          (int src_x,int dst_x,Boundary_Op boundary_op,_func_Resample_Real_Resample_Real *Pfilter,
          Resample_Real filter_support,Resample_Real filter_scale,Resample_Real src_ofs)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  void *p;
  Contrib_Bounds *pCVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Resample_Real RVar9;
  float fVar10;
  double dVar11;
  float local_a4;
  Resample_Real norm_1;
  Resample_Real max_w_1;
  int max_k_1;
  int total_1;
  Resample_Real norm;
  Resample_Real max_w;
  int max_k;
  int total;
  Resample_Real NUDGE;
  Resample_Real oo_filter_scale;
  Contrib_Bounds *Pcontrib_bounds;
  Contrib *Pcpool_next;
  Contrib *Pcpool;
  Contrib_List *Pcontrib;
  Resample_Real weight;
  Resample_Real half_width;
  Resample_Real center;
  Resample_Real xscale;
  Resample_Real total_weight;
  int right;
  int left;
  int n;
  int k;
  int j;
  int i;
  Resample_Real src_ofs_local;
  Resample_Real filter_scale_local;
  Resample_Real filter_support_local;
  _func_Resample_Real_Resample_Real *Pfilter_local;
  Boundary_Op boundary_op_local;
  int dst_x_local;
  int src_x_local;
  
  _dst_x_local = (Contrib_List *)crnlib_calloc((long)dst_x,0x10,(size_t *)0x0);
  if (_dst_x_local == (Contrib_List *)0x0) {
    _dst_x_local = (Contrib_List *)0x0;
  }
  else {
    p = crnlib_calloc((long)dst_x,0xc,(size_t *)0x0);
    if (p == (void *)0x0) {
      crnlib_free(_dst_x_local);
      _dst_x_local = (Contrib_List *)0x0;
    }
    else {
      fVar5 = 1.0 / filter_scale;
      fVar6 = (float)dst_x / (float)src_x;
      if (1.0 <= fVar6) {
        right = 0;
        for (k = 0; k < dst_x; k = k + 1) {
          fVar7 = src_ofs + (((float)k + 0.5) / fVar6 - 0.5);
          dVar11 = std::floor((double)(ulong)(uint)(fVar7 - filter_support * filter_scale));
          iVar2 = cast_to_int(SUB84(dVar11,0));
          dVar11 = std::ceil((double)(ulong)(uint)(fVar7 + filter_support * filter_scale));
          iVar3 = cast_to_int(SUB84(dVar11,0));
          *(float *)((long)p + (long)k * 0xc) = fVar7;
          *(int *)((long)p + (long)k * 0xc + 4) = iVar2;
          *(int *)((long)p + (long)k * 0xc + 8) = iVar3;
          right = (iVar3 - iVar2) + 1 + right;
        }
        if ((right == 0) ||
           (pCVar4 = (Contrib_Bounds *)crnlib_calloc((long)right,8,(size_t *)0x0),
           pCVar4 == (Contrib_Bounds *)0x0)) {
          crnlib_free(_dst_x_local);
          crnlib_free(p);
          return (Contrib_List *)0x0;
        }
        Pcontrib_bounds = pCVar4;
        for (k = 0; k < dst_x; k = k + 1) {
          norm_1 = -NAN;
          local_a4 = -1e+20;
          fVar6 = *(float *)((long)p + (long)k * 0xc);
          iVar2 = *(int *)((long)p + (long)k * 0xc + 4);
          iVar3 = *(int *)((long)p + (long)k * 0xc + 8);
          _dst_x_local[k].n = 0;
          _dst_x_local[k].p = (Contrib *)Pcontrib_bounds;
          Pcontrib_bounds =
               (Contrib_Bounds *)(&Pcontrib_bounds->center + (long)((iVar3 - iVar2) + 1) * 2);
          center = 0.0;
          for (n = iVar2; n <= iVar3; n = n + 1) {
            RVar9 = (*Pfilter)((fVar6 - (float)n) * fVar5);
            center = RVar9 + center;
          }
          fVar7 = 1.0 / center;
          center = 0.0;
          for (n = iVar2; n <= iVar3; n = n + 1) {
            RVar9 = (*Pfilter)((fVar6 - (float)n) * fVar5);
            fVar8 = RVar9 * fVar7;
            if ((fVar8 != 0.0) || (NAN(fVar8))) {
              iVar2 = reflect(n,src_x,boundary_op);
              uVar1 = _dst_x_local[k].n;
              _dst_x_local[k].n = uVar1 + 1;
              RVar9 = (Resample_Real)(uint)uVar1;
              _dst_x_local[k].p[(int)RVar9].pixel = (unsigned_short)iVar2;
              _dst_x_local[k].p[(int)RVar9].weight = fVar8;
              center = fVar8 + center;
              if (local_a4 < fVar8) {
                local_a4 = fVar8;
                norm_1 = RVar9;
              }
            }
          }
          if ((norm_1 == -NAN) || (_dst_x_local[k].n == 0)) {
            crnlib_free(pCVar4);
            crnlib_free(_dst_x_local);
            crnlib_free(p);
            return (Contrib_List *)0x0;
          }
          if ((center != 1.0) || (NAN(center))) {
            _dst_x_local[k].p[(int)norm_1].weight =
                 (1.0 - center) + _dst_x_local[k].p[(int)norm_1].weight;
          }
        }
      }
      else {
        fVar7 = (filter_support / fVar6) * filter_scale;
        right = 0;
        for (k = 0; k < dst_x; k = k + 1) {
          fVar8 = src_ofs + (((float)k + 0.5) / fVar6 - 0.5);
          dVar11 = std::floor((double)(ulong)(uint)(fVar8 - fVar7));
          iVar2 = cast_to_int(SUB84(dVar11,0));
          dVar11 = std::ceil((double)(ulong)(uint)(fVar8 + fVar7));
          iVar3 = cast_to_int(SUB84(dVar11,0));
          *(float *)((long)p + (long)k * 0xc) = fVar8;
          *(int *)((long)p + (long)k * 0xc + 4) = iVar2;
          *(int *)((long)p + (long)k * 0xc + 8) = iVar3;
          right = (iVar3 - iVar2) + 1 + right;
        }
        if ((right == 0) ||
           (pCVar4 = (Contrib_Bounds *)crnlib_calloc((long)right,8,(size_t *)0x0),
           pCVar4 == (Contrib_Bounds *)0x0)) {
          crnlib_free(_dst_x_local);
          crnlib_free(p);
          return (Contrib_List *)0x0;
        }
        Pcontrib_bounds = pCVar4;
        for (k = 0; k < dst_x; k = k + 1) {
          norm = -NAN;
          total_1 = -0x1f528714;
          fVar7 = *(float *)((long)p + (long)k * 0xc);
          iVar2 = *(int *)((long)p + (long)k * 0xc + 4);
          iVar3 = *(int *)((long)p + (long)k * 0xc + 8);
          _dst_x_local[k].n = 0;
          _dst_x_local[k].p = (Contrib *)Pcontrib_bounds;
          Pcontrib_bounds =
               (Contrib_Bounds *)(&Pcontrib_bounds->center + (long)((iVar3 - iVar2) + 1) * 2);
          center = 0.0;
          for (n = iVar2; n <= iVar3; n = n + 1) {
            RVar9 = (*Pfilter)((fVar7 - (float)n) * fVar6 * fVar5);
            center = RVar9 + center;
          }
          fVar8 = 1.0 / center;
          center = 0.0;
          for (n = iVar2; n <= iVar3; n = n + 1) {
            RVar9 = (*Pfilter)((fVar7 - (float)n) * fVar6 * fVar5);
            fVar10 = RVar9 * fVar8;
            if ((fVar10 != 0.0) || (NAN(fVar10))) {
              iVar2 = reflect(n,src_x,boundary_op);
              uVar1 = _dst_x_local[k].n;
              _dst_x_local[k].n = uVar1 + 1;
              RVar9 = (Resample_Real)(uint)uVar1;
              _dst_x_local[k].p[(int)RVar9].pixel = (unsigned_short)iVar2;
              _dst_x_local[k].p[(int)RVar9].weight = fVar10;
              center = fVar10 + center;
              if ((float)total_1 < fVar10) {
                total_1 = (int)fVar10;
                norm = RVar9;
              }
            }
          }
          if ((norm == -NAN) || (_dst_x_local[k].n == 0)) {
            crnlib_free(pCVar4);
            crnlib_free(_dst_x_local);
            crnlib_free(p);
            return (Contrib_List *)0x0;
          }
          if ((center != 1.0) || (NAN(center))) {
            _dst_x_local[k].p[(int)norm].weight =
                 (1.0 - center) + _dst_x_local[k].p[(int)norm].weight;
          }
        }
      }
      crnlib_free(p);
    }
  }
  return _dst_x_local;
}

Assistant:

Resampler::Contrib_List* Resampler::make_clist(
        int src_x, int dst_x, Boundary_Op boundary_op,
        Resample_Real (*Pfilter)(Resample_Real),
        Resample_Real filter_support,
        Resample_Real filter_scale,
        Resample_Real src_ofs)
    {
        typedef struct
        {
            // The center of the range in DISCRETE coordinates (pixel center = 0.0f).
            Resample_Real center;
            int left, right;
        } Contrib_Bounds;

        int i, j, k, n, left, right;
        Resample_Real total_weight;
        Resample_Real xscale, center, half_width, weight;
        Contrib_List* Pcontrib;
        Contrib* Pcpool;
        Contrib* Pcpool_next;
        Contrib_Bounds* Pcontrib_bounds;

        if ((Pcontrib = (Contrib_List*)crnlib_calloc(dst_x, sizeof(Contrib_List))) == nullptr)
        {
            return nullptr;
        }

        Pcontrib_bounds = (Contrib_Bounds*)crnlib_calloc(dst_x, sizeof(Contrib_Bounds));
        if (!Pcontrib_bounds)
        {
            crnlib_free(Pcontrib);
            return (nullptr);
        }

        const Resample_Real oo_filter_scale = 1.0f / filter_scale;

        const Resample_Real NUDGE = 0.5f;
        xscale = dst_x / (Resample_Real)src_x;

        if (xscale < 1.0f)
        {
            int total;
            (void)total;

            /* Handle case when there are fewer destination
         * samples than source samples (downsampling/minification).
         */

            // stretched half width of filter
            half_width = (filter_support / xscale) * filter_scale;

            // Find the range of source sample(s) that will contribute to each destination sample.

            for (i = 0, n = 0; i < dst_x; i++)
            {
                // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
                center = ((Resample_Real)i + NUDGE) / xscale;
                center -= NUDGE;
                center += src_ofs;

                left = cast_to_int((Resample_Real)floor(center - half_width));
                right = cast_to_int((Resample_Real)ceil(center + half_width));

                Pcontrib_bounds[i].center = center;
                Pcontrib_bounds[i].left = left;
                Pcontrib_bounds[i].right = right;

                n += (right - left + 1);
            }

            /* Allocate memory for contributors. */

            if ((n == 0) || ((Pcpool = (Contrib*)crnlib_calloc(n, sizeof(Contrib))) == nullptr))
            {
                crnlib_free(Pcontrib);
                crnlib_free(Pcontrib_bounds);
                return nullptr;
            }
            total = n;

            Pcpool_next = Pcpool;

            /* Create the list of source samples which
         * contribute to each destination sample.
         */

            for (i = 0; i < dst_x; i++)
            {
                int max_k = -1;
                Resample_Real max_w = -1e+20f;

                center = Pcontrib_bounds[i].center;
                left = Pcontrib_bounds[i].left;
                right = Pcontrib_bounds[i].right;

                Pcontrib[i].n = 0;
                Pcontrib[i].p = Pcpool_next;
                Pcpool_next += (right - left + 1);
                resampler_assert((Pcpool_next - Pcpool) <= total);

                total_weight = 0;

                for (j = left; j <= right; j++)
                {
                    total_weight += (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale);
                }
                const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

                total_weight = 0;

#if RESAMPLER_DEBUG
                printf("%i: ", i);
#endif

                for (j = left; j <= right; j++)
                {
                    weight = (*Pfilter)((center - (Resample_Real)j) * xscale * oo_filter_scale) * norm;
                    if (weight == 0.0f)
                    {
                        continue;
                    }

                    n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
                    printf("%i(%f), ", n, weight);
#endif

                    /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

                    k = Pcontrib[i].n++;

                    Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
                    Pcontrib[i].p[k].weight = weight; /* store src sample weight */

                    total_weight += weight; /* total weight of all contributors */

                    if (weight > max_w)
                    {
                        max_w = weight;
                        max_k = k;
                    }
                }

#if RESAMPLER_DEBUG
                printf("\n\n");
#endif

                //resampler_assert(Pcontrib[i].n);
                //resampler_assert(max_k != -1);
                if ((max_k == -1) || (Pcontrib[i].n == 0))
                {
                    crnlib_free(Pcpool);
                    crnlib_free(Pcontrib);
                    crnlib_free(Pcontrib_bounds);
                    return nullptr;
                }

                if (total_weight != 1.0f)
                {
                    Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
                }
            }
        }
        else
        {
            /* Handle case when there are more
         * destination samples than source
         * samples (upsampling).
         */

            half_width = filter_support * filter_scale;

            // Find the source sample(s) that contribute to each destination sample.

            for (i = 0, n = 0; i < dst_x; i++)
            {
                // Convert from discrete to continuous coordinates, scale, then convert back to discrete.
                center = ((Resample_Real)i + NUDGE) / xscale;
                center -= NUDGE;
                center += src_ofs;

                left = cast_to_int((Resample_Real)floor(center - half_width));
                right = cast_to_int((Resample_Real)ceil(center + half_width));

                Pcontrib_bounds[i].center = center;
                Pcontrib_bounds[i].left = left;
                Pcontrib_bounds[i].right = right;

                n += (right - left + 1);
            }

            /* Allocate memory for contributors. */

            int total = n;
            if ((total == 0) || ((Pcpool = (Contrib*)crnlib_calloc(total, sizeof(Contrib))) == nullptr))
            {
                crnlib_free(Pcontrib);
                crnlib_free(Pcontrib_bounds);
                return nullptr;
            }

            Pcpool_next = Pcpool;

            /* Create the list of source samples which
         * contribute to each destination sample.
         */

            for (i = 0; i < dst_x; i++)
            {
                int max_k = -1;
                Resample_Real max_w = -1e+20f;

                center = Pcontrib_bounds[i].center;
                left = Pcontrib_bounds[i].left;
                right = Pcontrib_bounds[i].right;

                Pcontrib[i].n = 0;
                Pcontrib[i].p = Pcpool_next;
                Pcpool_next += (right - left + 1);
                resampler_assert((Pcpool_next - Pcpool) <= total);

                total_weight = 0;
                for (j = left; j <= right; j++)
                {
                    total_weight += (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale);
                }

                const Resample_Real norm = static_cast<Resample_Real>(1.0f / total_weight);

                total_weight = 0;

#if RESAMPLER_DEBUG
                printf("%i: ", i);
#endif

                for (j = left; j <= right; j++)
                {
                    weight = (*Pfilter)((center - (Resample_Real)j) * oo_filter_scale) * norm;
                    if (weight == 0.0f)
                    {
                        continue;
                    }

                    n = reflect(j, src_x, boundary_op);

#if RESAMPLER_DEBUG
                    printf("%i(%f), ", n, weight);
#endif

                    /* Increment the number of source
               * samples which contribute to the
               * current destination sample.
               */

                    k = Pcontrib[i].n++;

                    Pcontrib[i].p[k].pixel = (unsigned short)n; /* store src sample number */
                    Pcontrib[i].p[k].weight = weight; /* store src sample weight */

                    total_weight += weight; /* total weight of all contributors */

                    if (weight > max_w)
                    {
                        max_w = weight;
                        max_k = k;
                    }
                }

#if RESAMPLER_DEBUG
                printf("\n\n");
#endif

                //resampler_assert(Pcontrib[i].n);
                //resampler_assert(max_k != -1);

                if ((max_k == -1) || (Pcontrib[i].n == 0))
                {
                    crnlib_free(Pcpool);
                    crnlib_free(Pcontrib);
                    crnlib_free(Pcontrib_bounds);
                    return nullptr;
                }

                if (total_weight != 1.0f)
                {
                    Pcontrib[i].p[max_k].weight += 1.0f - total_weight;
                }
            }
        }

#if RESAMPLER_DEBUG
        printf("*******\n");
#endif

        crnlib_free(Pcontrib_bounds);

        return Pcontrib;
    }